

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O3

void duckdb::
     HistogramUpdateFunction<duckdb::HistogramFunctor,unsigned_int,duckdb::DefaultMapType<std::map<unsigned_int,unsigned_long,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  long *plVar1;
  ulong uVar2;
  map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  *this;
  mapped_type_conflict *pmVar3;
  _Rb_tree_header *p_Var4;
  ulong uVar5;
  ulong uVar6;
  UnifiedVectorFormat input_data;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(inputs,count,&local_c0);
  if (count != 0) {
    uVar5 = 0;
    do {
      uVar6 = uVar5;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        uVar6 = (ulong)(local_c0.sel)->sel_vector[uVar5];
      }
      if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6 >> 6] >>
           (uVar6 & 0x3f) & 1) != 0)) {
        uVar2 = uVar5;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar2 = (ulong)(local_78.sel)->sel_vector[uVar5];
        }
        plVar1 = *(long **)(local_78.data + uVar2 * 8);
        this = (map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                *)*plVar1;
        if (this == (map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                     *)0x0) {
          this = (map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                  *)operator_new(0x30);
          p_Var4 = &(this->_M_t)._M_impl.super__Rb_tree_header;
          (this->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          (this->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
          *(undefined8 *)&(this->_M_t)._M_impl = 0;
          *(undefined8 *)&(this->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
          (this->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
          (this->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
          (this->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
          *plVar1 = (long)this;
        }
        pmVar3 = ::std::
                 map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                 ::operator[](this,(key_type_conflict *)(local_c0.data + uVar6 * 4));
        *pmVar3 = *pmVar3 + 1;
      }
      uVar5 = uVar5 + 1;
    } while (count != uVar5);
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void HistogramUpdateFunction(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count,
                                    Vector &state_vector, idx_t count) {

	D_ASSERT(input_count == 1);

	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, typename MAP_TYPE::MAP_TYPE> *>(sdata);
	auto input_values = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			state.hist = MAP_TYPE::CreateEmpty(aggr_input.allocator);
		}
		auto &input_value = input_values[idx];
		++(*state.hist)[input_value];
	}
}